

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::IntegerDecimalCastOperation::
     Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
               (IntegerDecimalCastData<unsigned_int> *state)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uint16_t uVar4;
  ulong uVar5;
  result_t tmp;
  uint local_14;
  
  uVar5 = state->result;
  if (uVar5 >> 0x20 == 0) {
    local_14 = (uint)uVar5;
    uVar2 = state->decimal;
    uVar4 = state->decimal_digits;
    uVar3 = uVar2;
    if (10 < (long)uVar2) {
      do {
        uVar3 = uVar2 / 10;
        uVar4 = uVar4 - 1;
        bVar1 = 0x6d < uVar2;
        uVar2 = uVar3;
      } while (bVar1);
      state->decimal = uVar3;
      state->decimal_digits = uVar4;
    }
    bVar1 = true;
    if ((4 < (long)uVar3) && (uVar4 == 1)) {
      bVar1 = TrySubtractOperator::Operation<unsigned_int,unsigned_int,unsigned_int>
                        (local_14,1,&local_14);
      uVar5 = (ulong)local_14;
    }
    state->result = uVar5 & 0xffffffff;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}